

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::ReservoirQuantileState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::ReservoirQuantileScalarOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  hugeint_t *phVar1;
  ReservoirQuantileState<duckdb::hugeint_t> *state;
  ReservoirQuantileState<duckdb::hugeint_t> **states_00;
  FunctionData *pFVar2;
  ulong uVar3;
  ulong uVar4;
  AggregateUnaryInput input_1;
  AggregateUnaryInput input_data;
  UnifiedVectorFormat sdata;
  AggregateUnaryInput local_d8;
  undefined1 local_c0 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  long local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if ((*input == (Vector)0x2) && (*states == (Vector)0x2)) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      phVar1 = *(hugeint_t **)(input + 0x20);
      local_c0._8_8_ = input + 0x28;
      local_c0._16_8_ = 0;
      if (count != 0) {
        state = (ReservoirQuantileState<duckdb::hugeint_t> *)**(undefined8 **)(states + 0x20);
        local_c0._0_8_ = aggr_input_data;
        do {
          ReservoirQuantileOperation::
          Operation<duckdb::hugeint_t,duckdb::ReservoirQuantileState<duckdb::hugeint_t>,duckdb::ReservoirQuantileScalarOperation>
                    (state,phVar1,(AggregateUnaryInput *)local_c0);
          count = count - 1;
        } while (count != 0);
      }
    }
  }
  else {
    if (*input == (Vector)0x0 && *states == (Vector)0x0) {
      phVar1 = *(hugeint_t **)(input + 0x20);
      states_00 = *(ReservoirQuantileState<duckdb::hugeint_t> ***)(states + 0x20);
      FlatVector::VerifyFlatVector(input);
      UnaryFlatLoop<duckdb::ReservoirQuantileState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::ReservoirQuantileScalarOperation>
                (phVar1,aggr_input_data,states_00,(ValidityMask *)(input + 0x28),count);
      return;
    }
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    duckdb::Vector::ToUnifiedFormat((ulong)states,(UnifiedVectorFormat *)count);
    local_d8.input_mask = (ValidityMask *)(local_c0 + 0x10);
    local_d8.input = aggr_input_data;
    if (local_c0._16_8_ == 0) {
      local_d8.input_idx = 0;
      if (count != 0) {
        uVar4 = 0;
        do {
          pFVar2 = ((optional_ptr<duckdb::FunctionData,_true> *)local_c0._0_8_)->ptr;
          local_d8.input_idx = uVar4;
          if (pFVar2 != (FunctionData *)0x0) {
            local_d8.input_idx = (idx_t)*(uint *)(pFVar2 + uVar4 * 4);
          }
          uVar3 = uVar4;
          if (*local_78 != 0) {
            uVar3 = (ulong)*(uint *)(*local_78 + uVar4 * 4);
          }
          ReservoirQuantileOperation::
          Operation<duckdb::hugeint_t,duckdb::ReservoirQuantileState<duckdb::hugeint_t>,duckdb::ReservoirQuantileScalarOperation>
                    (*(ReservoirQuantileState<duckdb::hugeint_t> **)(local_70 + uVar3 * 8),
                     (hugeint_t *)
                     (&((TemplatedValidityMask<unsigned_long> *)local_c0._8_8_)->validity_mask +
                     local_d8.input_idx * 2),&local_d8);
          uVar4 = uVar4 + 1;
        } while (count != uVar4);
      }
    }
    else {
      local_d8.input_idx = 0;
      if (count != 0) {
        uVar4 = 0;
        do {
          pFVar2 = ((optional_ptr<duckdb::FunctionData,_true> *)local_c0._0_8_)->ptr;
          local_d8.input_idx = uVar4;
          if (pFVar2 != (FunctionData *)0x0) {
            local_d8.input_idx = (idx_t)*(uint *)(pFVar2 + uVar4 * 4);
          }
          uVar3 = uVar4;
          if (*local_78 != 0) {
            uVar3 = (ulong)*(uint *)(*local_78 + uVar4 * 4);
          }
          if ((local_c0._16_8_ == 0) ||
             ((*(ulong *)(local_c0._16_8_ + (local_d8.input_idx >> 6) * 8) >>
               (local_d8.input_idx & 0x3f) & 1) != 0)) {
            ReservoirQuantileOperation::
            Operation<duckdb::hugeint_t,duckdb::ReservoirQuantileState<duckdb::hugeint_t>,duckdb::ReservoirQuantileScalarOperation>
                      (*(ReservoirQuantileState<duckdb::hugeint_t> **)(local_70 + uVar3 * 8),
                       (hugeint_t *)
                       (&((TemplatedValidityMask<unsigned_long> *)local_c0._8_8_)->validity_mask +
                       local_d8.input_idx * 2),&local_d8);
          }
          uVar4 = uVar4 + 1;
        } while (count != uVar4);
      }
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
    }
    if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
    }
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}